

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value chaiscript::Boxed_Number::const_unary_go<long_double>(Opers t_oper,longdouble *t)

{
  undefined8 uVar1;
  int in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar3;
  longdouble *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  if (in_ESI == 0x23) {
    BVar3 = const_var<long_double>(in_stack_ffffffffffffffa8);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    if (in_ESI != 0x24) {
      uVar1 = __cxa_allocate_exception(0x28);
      chaiscript::detail::exception::bad_any_cast::bad_any_cast
                ((bad_any_cast *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
      __cxa_throw(uVar1,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                  chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
    }
    BVar3 = const_var<long_double>(in_stack_ffffffffffffffa8);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value const_unary_go(Operators::Opers t_oper, const T &t)
      {
        switch (t_oper)
        {
          case Operators::unary_minus:
            return const_var(-t);
          case Operators::unary_plus:
            return const_var(+t);
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
      }